

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.hpp
# Opt level: O1

void __thiscall boost::deflate::detail::window::reset(window *this,int bits)

{
  _Head_base<0UL,_unsigned_char_*,_false> _Var1;
  
  if ((uint)this->bits_ != bits) {
    _Var1._M_head_impl =
         (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
         ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (this->p_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
    if (_Var1._M_head_impl != (uchar *)0x0) {
      operator_delete__(_Var1._M_head_impl);
    }
    this->bits_ = (byte)bits;
    this->capacity_ = (uint16_t)(1 << ((byte)bits & 0x1f));
  }
  this->i_ = 0;
  this->size_ = 0;
  return;
}

Assistant:

void
    reset(int bits)
    {
        if(bits_ != bits)
        {
            p_.reset();
            bits_ = static_cast<std::uint8_t>(bits);
            capacity_ = 1U << bits_;
        }
        i_ = 0;
        size_ = 0;
    }